

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void vorbis_deinit(stb_vorbis *p)

{
  bool bVar1;
  long lVar2;
  long in_RDI;
  Codebook *c;
  Residue *r;
  int j;
  int i;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar3;
  vorb *in_stack_ffffffffffffffd0;
  int local_10;
  int local_c;
  
  setup_free(in_stack_ffffffffffffffd0,
             (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x20); local_c = local_c + 1) {
    setup_free(in_stack_ffffffffffffffd0,
               (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  setup_free(in_stack_ffffffffffffffd0,
             (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (*(long *)(in_RDI + 0x1d8) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x150); local_c = local_c + 1) {
      lVar2 = *(long *)(in_RDI + 0x1d8) + (long)local_c * 0x20;
      if (*(long *)(lVar2 + 0x10) != 0) {
        for (local_10 = 0;
            local_10 <
            *(int *)(*(long *)(in_RDI + 0xb8) + (ulong)*(byte *)(lVar2 + 0xd) * 0x848 + 4);
            local_10 = local_10 + 1) {
          setup_free(in_stack_ffffffffffffffd0,
                     (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
        }
        setup_free(in_stack_ffffffffffffffd0,
                   (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      }
      setup_free(in_stack_ffffffffffffffd0,
                 (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    }
  }
  if (*(long *)(in_RDI + 0xb8) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0xb0); local_c = local_c + 1) {
      lVar2 = *(long *)(in_RDI + 0xb8) + (long)local_c * 0x848;
      setup_free(in_stack_ffffffffffffffd0,
                 (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      setup_free(in_stack_ffffffffffffffd0,
                 (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      setup_free(in_stack_ffffffffffffffd0,
                 (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      setup_free(in_stack_ffffffffffffffd0,
                 (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      if (*(long *)(lVar2 + 0x838) == 0) {
        in_stack_ffffffffffffffd0 = (vorb *)0x0;
      }
      else {
        in_stack_ffffffffffffffd0 = (vorb *)(*(long *)(lVar2 + 0x838) + -4);
      }
      setup_free(in_stack_ffffffffffffffd0,
                 (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    }
    setup_free(in_stack_ffffffffffffffd0,
               (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  setup_free(in_stack_ffffffffffffffd0,
             (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  setup_free(in_stack_ffffffffffffffd0,
             (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (*(long *)(in_RDI + 0x1e8) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x1e0); local_c = local_c + 1) {
      setup_free(in_stack_ffffffffffffffd0,
                 (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    }
    setup_free(in_stack_ffffffffffffffd0,
               (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  for (local_c = 0; bVar1 = local_c < *(int *)(in_RDI + 4), uVar3 = bVar1 && local_c < 0x10,
      bVar1 && local_c < 0x10; local_c = local_c + 1) {
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
  }
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
    setup_free(in_stack_ffffffffffffffd0,(void *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
  }
  if (*(int *)(in_RDI + 0x3c) != 0) {
    fclose(*(FILE **)(in_RDI + 0x30));
  }
  return;
}

Assistant:

static void vorbis_deinit(stb_vorbis *p)
{
   int i,j;

   setup_free(p, p->vendor);
   for (i=0; i < p->comment_list_length; ++i) {
      setup_free(p, p->comment_list[i]);
   }
   setup_free(p, p->comment_list);

   if (p->residue_config) {
      for (i=0; i < p->residue_count; ++i) {
         Residue *r = p->residue_config+i;
         if (r->classdata) {
            for (j=0; j < p->codebooks[r->classbook].entries; ++j)
               setup_free(p, r->classdata[j]);
            setup_free(p, r->classdata);
         }
         setup_free(p, r->residue_books);
      }
   }

   if (p->codebooks) {
      CHECK(p);
      for (i=0; i < p->codebook_count; ++i) {
         Codebook *c = p->codebooks + i;
         setup_free(p, c->codeword_lengths);
         setup_free(p, c->multiplicands);
         setup_free(p, c->codewords);
         setup_free(p, c->sorted_codewords);
         // c->sorted_values[-1] is the first entry in the array
         setup_free(p, c->sorted_values ? c->sorted_values-1 : NULL);
      }
      setup_free(p, p->codebooks);
   }
   setup_free(p, p->floor_config);
   setup_free(p, p->residue_config);
   if (p->mapping) {
      for (i=0; i < p->mapping_count; ++i)
         setup_free(p, p->mapping[i].chan);
      setup_free(p, p->mapping);
   }
   CHECK(p);
   for (i=0; i < p->channels && i < STB_VORBIS_MAX_CHANNELS; ++i) {
      setup_free(p, p->channel_buffers[i]);
      setup_free(p, p->previous_window[i]);
      #ifdef STB_VORBIS_NO_DEFER_FLOOR
      setup_free(p, p->floor_buffers[i]);
      #endif
      setup_free(p, p->finalY[i]);
   }
   for (i=0; i < 2; ++i) {
      setup_free(p, p->A[i]);
      setup_free(p, p->B[i]);
      setup_free(p, p->C[i]);
      setup_free(p, p->window[i]);
      setup_free(p, p->bit_reverse[i]);
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (p->close_on_free) fclose(p->f);
   #endif
}